

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

string * __thiscall
QPDFObjectHandle::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFObjectHandle *this)

{
  element_type *peVar1;
  QPDFObjGen local_38;
  string local_30;
  
  peVar1 = (this->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) || (local_38 = peVar1->og, local_38.obj == 0)) {
    unparseResolved_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    QPDFObjGen::unparse_abi_cxx11_(&local_30,&local_38,' ');
    std::operator+(__return_storage_ptr__,&local_30," R");
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFObjectHandle::unparse() const
{
    if (this->isIndirect()) {
        return getObjGen().unparse(' ') + " R";
    } else {
        return unparseResolved();
    }
}